

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall
QPDFArgParser::addOptionsToCompletions(QPDFArgParser *this,option_table_t *option_table)

{
  _Rb_tree_node_base *__lhs;
  bool bVar1;
  _Base_ptr p_Var2;
  element_type *peVar3;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (p_Var2 = (option_table->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(option_table->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    __lhs = p_Var2 + 1;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"--");
    if (!bVar1) {
      std::operator+(&local_50,"--",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      if (p_Var2[6]._M_parent != (_Base_ptr)0x0) {
        peVar3 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (peVar3->zsh_completion == true) {
          std::operator+(&local_70,&local_50,"=");
          addChoicesToCompletions(this,option_table,(string *)__lhs,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          peVar3 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        }
        std::operator+(&local_70,&local_50,"=");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&peVar3->completions,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if ((char)p_Var2[2]._M_color == _S_red) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&((this->m).
                        super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->completions,&local_50);
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void
QPDFArgParser::addOptionsToCompletions(option_table_t& option_table)
{
    for (auto& iter: option_table) {
        std::string const& arg = iter.first;
        if (arg == "--") {
            continue;
        }
        OptionEntry& oe = iter.second;
        std::string base = "--" + arg;
        if (oe.param_arg_handler) {
            if (m->zsh_completion) {
                // zsh doesn't treat = as a word separator, so add all the options so we don't get a
                // space after the =.
                addChoicesToCompletions(option_table, arg, base + "=");
            }
            m->completions.insert(base + "=");
        }
        if (!oe.parameter_needed) {
            m->completions.insert(base);
        }
    }
}